

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDeleteView.cpp
# Opt level: O0

void __thiscall UserDeleteView::display(UserDeleteView *this)

{
  bool bVar1;
  int iVar2;
  Application *this_00;
  BaseUser *this_01;
  char *__lhs;
  ostream *this_02;
  Controller *this_03;
  View *pVVar3;
  allocator local_89;
  string local_88;
  BaseUser *local_68;
  BaseUser *user;
  string local_50 [32];
  undefined1 local_30 [8];
  string email;
  UserDeleteView *this_local;
  
  email.field_2._8_8_ = this;
  std::operator<<((ostream *)&std::cout,"Enter the email of user to delete: ");
  std::__cxx11::string::string((string *)local_30);
  Input::getEmail_abi_cxx11_();
  std::__cxx11::string::operator=((string *)local_30,local_50);
  std::__cxx11::string::~string(local_50);
  local_68 = BaseUser::findByEmail((string *)local_30);
  if (local_68 == (BaseUser *)0x0) {
    std::operator<<((ostream *)&std::cout,"No user with this email exists.\n");
  }
  else {
    this_00 = Application::getInstance();
    this_01 = Application::getCurrentUser(this_00);
    __lhs = BaseUser::getEmail(this_01);
    bVar1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30);
    if (bVar1) {
      this_02 = std::operator<<((ostream *)&std::cout,"You cannot delete yourself!");
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    }
    else {
      iVar2 = Model<BaseUser>::getId(&local_68->super_Model<BaseUser>);
      (this->super_DeleteView<BaseUser>).super_View.context.requestObjectId = iVar2;
      DeleteView<BaseUser>::display(&this->super_DeleteView<BaseUser>);
    }
  }
  this_03 = Controller::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"admin-panel",&local_89);
  pVVar3 = Controller::getView(this_03,&local_88);
  View::response->view = pVVar3;
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void UserDeleteView::display() {
    cout << "Enter the email of user to delete: ";
    string email;
    email = Input::getEmail();
    BaseUser *user = BaseUser::findByEmail(email);
    if (!user) {
        cout << "No user with this email exists.\n";
    }
    else if (Application::getInstance().getCurrentUser()->getEmail() == email)
        cout << "You cannot delete yourself!" << endl;
    else {
        context.requestObjectId = user->getId();
        DeleteView::display();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}